

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerManager.cpp
# Opt level: O0

bool __thiscall ServerManager::freeServer(ServerManager *this,IRC_Bot *server)

{
  bool bVar1;
  pointer this_00;
  pointer pIVar2;
  const_iterator local_38;
  __normal_iterator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_*,_std::vector<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>_>
  local_30;
  __normal_iterator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_*,_std::vector<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>_>
  local_28;
  iterator itr;
  IRC_Bot *server_local;
  ServerManager *this_local;
  
  itr._M_current = (unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_> *)server;
  local_28._M_current =
       (unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_> *)
       std::
       vector<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>
       ::begin(&this->m_servers);
  while( true ) {
    local_30._M_current =
         (unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_> *)
         std::
         vector<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>
         ::end(&this->m_servers);
    bVar1 = __gnu_cxx::
            operator==<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_*,_std::vector<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>_>
                      (&local_28,&local_30);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return false;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_*,_std::vector<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>_>
              ::operator->(&local_28);
    pIVar2 = std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>::get(this_00);
    if (pIVar2 == (pointer)itr._M_current) break;
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_*,_std::vector<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>_>
    ::operator++(&local_28);
  }
  __gnu_cxx::
  __normal_iterator<std::unique_ptr<IRC_Bot,std::default_delete<IRC_Bot>>const*,std::vector<std::unique_ptr<IRC_Bot,std::default_delete<IRC_Bot>>,std::allocator<std::unique_ptr<IRC_Bot,std::default_delete<IRC_Bot>>>>>
  ::__normal_iterator<std::unique_ptr<IRC_Bot,std::default_delete<IRC_Bot>>*>
            ((__normal_iterator<std::unique_ptr<IRC_Bot,std::default_delete<IRC_Bot>>const*,std::vector<std::unique_ptr<IRC_Bot,std::default_delete<IRC_Bot>>,std::allocator<std::unique_ptr<IRC_Bot,std::default_delete<IRC_Bot>>>>>
              *)&local_38,&local_28);
  std::
  vector<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>
  ::erase(&this->m_servers,local_38);
  return true;
}

Assistant:

bool ServerManager::freeServer(IRC_Bot *server) {
	for (auto itr = m_servers.begin(); itr != m_servers.end(); ++itr) {
		if (itr->get() == server) {
			m_servers.erase(itr);
			return true;
		}
	}

	return false;
}